

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

PtexFilter * Ptex::v2_2::PtexFilter::getFilter(PtexTexture *tex,Options *opts)

{
  PtexFilter PVar1;
  int iVar2;
  PtexFilter *pPVar3;
  PtexBicubicFilter *this;
  undefined **ppuVar4;
  
  iVar2 = (*tex->_vptr_PtexTexture[5])();
  if (iVar2 == 0) {
    if (opts->filter != f_point) {
      pPVar3 = (PtexFilter *)operator_new(0x48);
      pPVar3->_vptr_PtexFilter = (_func_int **)&PTR__PtexFilter_031e8fd8;
      pPVar3[1]._vptr_PtexFilter = (_func_int **)tex;
      PVar1._vptr_PtexFilter = *(_func_int ***)&opts->lerp;
      pPVar3[2]._vptr_PtexFilter = *(_func_int ***)opts;
      pPVar3[3]._vptr_PtexFilter = PVar1._vptr_PtexFilter;
      *(undefined4 *)&pPVar3[4]._vptr_PtexFilter = *(undefined4 *)&opts->noedgeblend;
      pPVar3[5]._vptr_PtexFilter = (_func_int **)0x0;
      pPVar3[6]._vptr_PtexFilter = (_func_int **)0x0;
      *(undefined8 *)((long)&pPVar3[6]._vptr_PtexFilter + 4) = 0;
      *(undefined8 *)((long)&pPVar3[7]._vptr_PtexFilter + 4) = 0;
      return pPVar3;
    }
    pPVar3 = (PtexFilter *)operator_new(0x10);
    ppuVar4 = &PTR__PtexFilter_031e8908;
LAB_005dbac9:
    pPVar3->_vptr_PtexFilter = (_func_int **)ppuVar4;
    pPVar3[1]._vptr_PtexFilter = (_func_int **)tex;
    return pPVar3;
  }
  if (iVar2 != 1) {
    return (PtexFilter *)0x0;
  }
  switch(opts->filter) {
  case f_point:
    pPVar3 = (PtexFilter *)operator_new(0x10);
    ppuVar4 = &PTR__PtexFilter_031e8758;
    goto LAB_005dbac9;
  case f_bilinear:
    this = (PtexBicubicFilter *)operator_new(0x50);
    PtexSeparableFilter::PtexSeparableFilter((PtexSeparableFilter *)this,tex,opts);
    ppuVar4 = &PTR__PtexFilter_031e87b0;
    goto LAB_005dbc1c;
  default:
    this = (PtexBicubicFilter *)operator_new(0x50);
    PtexSeparableFilter::PtexSeparableFilter((PtexSeparableFilter *)this,tex,opts);
    ppuVar4 = &PTR__PtexFilter_031e8800;
    goto LAB_005dbc1c;
  case f_gaussian:
    this = (PtexBicubicFilter *)operator_new(0x60);
    PtexSeparableFilter::PtexSeparableFilter((PtexSeparableFilter *)this,tex,opts);
    (this->super_PtexWidth4Filter)._k = PtexGaussianFilter::kernelFn;
    (this->super_PtexWidth4Filter)._c = (float *)0x0;
    ppuVar4 = &PTR__PtexFilter_031e8850;
LAB_005dbc1c:
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)ppuVar4;
    break;
  case f_bicubic:
    this = (PtexBicubicFilter *)operator_new(0x80);
    PtexBicubicFilter::PtexBicubicFilter(this,tex,opts,opts->sharpness);
    break;
  case f_bspline:
    this = (PtexBicubicFilter *)operator_new(0x80);
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)&PTR__PtexFilter_031e88b8;
    PtexSeparableFilter::PtexSeparableFilter((PtexSeparableFilter *)this,tex,opts);
    (this->super_PtexWidth4Filter)._k = PtexBicubicFilter::kernelFn;
    (this->super_PtexWidth4Filter)._c = this->_coeffs;
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)&PTR__PtexFilter_031e88b8;
    this->_coeffs[0] = 0.5;
    this->_coeffs[1] = -1.0;
    this->_coeffs[2] = 0.6666666;
    this->_coeffs[3] = -0.16666666;
    this->_coeffs[4] = 1.0;
    this->_coeffs[5] = -2.0;
    this->_coeffs[6] = 1.3333333;
    break;
  case f_catmullrom:
    this = (PtexBicubicFilter *)operator_new(0x80);
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)&PTR__PtexFilter_031e88b8;
    PtexSeparableFilter::PtexSeparableFilter((PtexSeparableFilter *)this,tex,opts);
    (this->super_PtexWidth4Filter)._k = PtexBicubicFilter::kernelFn;
    (this->super_PtexWidth4Filter)._c = this->_coeffs;
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)&PTR__PtexFilter_031e88b8;
    this->_coeffs[0] = 1.5;
    this->_coeffs[1] = -2.5;
    this->_coeffs[2] = 1.0;
    this->_coeffs[3] = -0.5;
    this->_coeffs[4] = 2.5;
    this->_coeffs[5] = -4.0;
    this->_coeffs[6] = 2.0;
    break;
  case f_mitchell:
    this = (PtexBicubicFilter *)operator_new(0x80);
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)&PTR__PtexFilter_031e88b8;
    PtexSeparableFilter::PtexSeparableFilter((PtexSeparableFilter *)this,tex,opts);
    (this->super_PtexWidth4Filter)._k = PtexBicubicFilter::kernelFn;
    (this->super_PtexWidth4Filter)._c = this->_coeffs;
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)&PTR__PtexFilter_031e88b8;
    this->_coeffs[0] = 1.1666667;
    this->_coeffs[1] = -2.0;
    this->_coeffs[2] = 0.8888889;
    this->_coeffs[3] = -0.3888889;
    this->_coeffs[4] = 2.0;
    this->_coeffs[5] = -3.3333335;
    this->_coeffs[6] = 1.7777778;
  }
  return (PtexFilter *)this;
}

Assistant:

PtexFilter* PtexFilter::getFilter(PtexTexture* tex, const PtexFilter::Options& opts)
{
    switch (tex->meshType()) {
    case Ptex::mt_quad:
        switch (opts.filter) {
        case f_point:       return new PtexPointFilter(tex);
        case f_bilinear:    return new PtexBilinearFilter(tex, opts);
        default:
        case f_box:         return new PtexBoxFilter(tex, opts);
        case f_gaussian:    return new PtexGaussianFilter(tex, opts);
        case f_bicubic:     return new PtexBicubicFilter(tex, opts, opts.sharpness);
        case f_bspline:     return new PtexBicubicFilter(tex, opts, 0.f);
        case f_catmullrom:  return new PtexBicubicFilter(tex, opts, 1.f);
        case f_mitchell:    return new PtexBicubicFilter(tex, opts, 2.f/3.f);
        }
        break;

    case Ptex::mt_triangle:
        switch (opts.filter) {
        case f_point:       return new PtexPointFilterTri(tex);
        default:            return new PtexTriangleFilter(tex, opts);
        }
        break;
    }
    return 0;
}